

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

void duckdb::IsFiniteFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *this;
  ScalarFunctionSet *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  initializer_list<duckdb::LogicalType> __l_03;
  allocator_type local_819;
  LogicalType local_818 [24];
  code *local_800 [2];
  code *local_7f0;
  code *local_7e8;
  code *local_7e0 [2];
  code *local_7d0;
  code *local_7c8;
  code *local_7c0 [2];
  code *local_7b0;
  code *local_7a8;
  code *local_7a0 [2];
  code *local_790;
  code *local_788;
  code *local_780 [2];
  code *local_770;
  code *local_768;
  LogicalType local_760 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_748;
  LogicalType local_730 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_718;
  LogicalType local_700 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_6e8;
  LogicalType local_6d0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_6b8;
  LogicalType local_6a0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_688;
  LogicalType local_670 [24];
  LogicalType local_658 [24];
  LogicalType local_640 [24];
  LogicalType local_628 [24];
  LogicalType local_610 [24];
  ScalarFunction local_5f8;
  ScalarFunction local_4d0;
  ScalarFunction local_3a8;
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  duckdb::LogicalType::LogicalType(local_818,FLOAT);
  __l._M_len = 1;
  __l._M_array = local_818;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_688,__l,&local_819);
  duckdb::LogicalType::LogicalType(local_6a0,BOOLEAN);
  local_780[1] = (code *)0x0;
  local_780[0] = ScalarFunction::UnaryFunction<float,bool,duckdb::IsFiniteOperator>;
  local_768 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_770 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_610,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_158,&local_688,local_6a0,local_780,0,0,0,0,local_610,0,0,0);
  this = (vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)(in_RDI + 0x20);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_158);
  ScalarFunction::~ScalarFunction(&local_158);
  duckdb::LogicalType::~LogicalType(local_610);
  std::_Function_base::~_Function_base((_Function_base *)local_780);
  duckdb::LogicalType::~LogicalType(local_6a0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_688);
  duckdb::LogicalType::~LogicalType(local_818);
  duckdb::LogicalType::LogicalType(local_818,DOUBLE);
  __l_00._M_len = 1;
  __l_00._M_array = local_818;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_6b8,__l_00,&local_819);
  duckdb::LogicalType::LogicalType(local_6d0,BOOLEAN);
  local_7a0[1] = (code *)0x0;
  local_7a0[0] = ScalarFunction::UnaryFunction<double,bool,duckdb::IsFiniteOperator>;
  local_788 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_790 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_628,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_280,&local_6b8,local_6d0,local_7a0,0,0,0,0,local_628,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_280);
  ScalarFunction::~ScalarFunction(&local_280);
  duckdb::LogicalType::~LogicalType(local_628);
  std::_Function_base::~_Function_base((_Function_base *)local_7a0);
  duckdb::LogicalType::~LogicalType(local_6d0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_6b8);
  duckdb::LogicalType::~LogicalType(local_818);
  duckdb::LogicalType::LogicalType(local_818,DATE);
  __l_01._M_len = 1;
  __l_01._M_array = local_818;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_6e8,__l_01,&local_819);
  duckdb::LogicalType::LogicalType(local_700,BOOLEAN);
  local_7c0[1] = (code *)0x0;
  local_7c0[0] = ScalarFunction::UnaryFunction<duckdb::date_t,bool,duckdb::IsFiniteOperator>;
  local_7a8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_7b0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_640,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_3a8,&local_6e8,local_700,local_7c0,0,0,0,0,local_640,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_3a8);
  ScalarFunction::~ScalarFunction(&local_3a8);
  duckdb::LogicalType::~LogicalType(local_640);
  std::_Function_base::~_Function_base((_Function_base *)local_7c0);
  duckdb::LogicalType::~LogicalType(local_700);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_6e8);
  duckdb::LogicalType::~LogicalType(local_818);
  duckdb::LogicalType::LogicalType(local_818,TIMESTAMP);
  __l_02._M_len = 1;
  __l_02._M_array = local_818;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_718,__l_02,&local_819);
  duckdb::LogicalType::LogicalType(local_730,BOOLEAN);
  local_7e0[1] = (code *)0x0;
  local_7e0[0] = ScalarFunction::UnaryFunction<duckdb::timestamp_t,bool,duckdb::IsFiniteOperator>;
  local_7c8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_7d0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_658,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_4d0,&local_718,local_730,local_7e0,0,0,0,0,local_658,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_4d0);
  ScalarFunction::~ScalarFunction(&local_4d0);
  duckdb::LogicalType::~LogicalType(local_658);
  std::_Function_base::~_Function_base((_Function_base *)local_7e0);
  duckdb::LogicalType::~LogicalType(local_730);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_718);
  duckdb::LogicalType::~LogicalType(local_818);
  duckdb::LogicalType::LogicalType(local_818,TIMESTAMP_TZ);
  __l_03._M_len = 1;
  __l_03._M_array = local_818;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_748,__l_03,&local_819);
  duckdb::LogicalType::LogicalType(local_760,BOOLEAN);
  local_800[1] = (code *)0x0;
  local_800[0] = ScalarFunction::UnaryFunction<duckdb::timestamp_t,bool,duckdb::IsFiniteOperator>;
  local_7e8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_7f0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_670,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_5f8,&local_748,local_760,local_800,0,0,0,0,local_670,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_5f8);
  ScalarFunction::~ScalarFunction(&local_5f8);
  duckdb::LogicalType::~LogicalType(local_670);
  std::_Function_base::~_Function_base((_Function_base *)local_800);
  duckdb::LogicalType::~LogicalType(local_760);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_748);
  duckdb::LogicalType::~LogicalType(local_818);
  return;
}

Assistant:

ScalarFunctionSet IsFiniteFun::GetFunctions() {
	ScalarFunctionSet funcs;
	funcs.AddFunction(ScalarFunction({LogicalType::FLOAT}, LogicalType::BOOLEAN,
	                                 ScalarFunction::UnaryFunction<float, bool, IsFiniteOperator>));
	funcs.AddFunction(ScalarFunction({LogicalType::DOUBLE}, LogicalType::BOOLEAN,
	                                 ScalarFunction::UnaryFunction<double, bool, IsFiniteOperator>));
	funcs.AddFunction(ScalarFunction({LogicalType::DATE}, LogicalType::BOOLEAN,
	                                 ScalarFunction::UnaryFunction<date_t, bool, IsFiniteOperator>));
	funcs.AddFunction(ScalarFunction({LogicalType::TIMESTAMP}, LogicalType::BOOLEAN,
	                                 ScalarFunction::UnaryFunction<timestamp_t, bool, IsFiniteOperator>));
	funcs.AddFunction(ScalarFunction({LogicalType::TIMESTAMP_TZ}, LogicalType::BOOLEAN,
	                                 ScalarFunction::UnaryFunction<timestamp_t, bool, IsFiniteOperator>));
	return funcs;
}